

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

Result<wallet::MigrationResult> *
wallet::MigrateLegacyToDescriptor
          (Result<wallet::MigrationResult> *__return_storage_ptr__,string *wallet_name,
          SecureString *passphrase,WalletContext *context)

{
  undefined8 *puVar1;
  ulong *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer *ppbVar6;
  long lVar7;
  WalletDatabase *pWVar8;
  pointer pcVar9;
  pointer __s;
  _Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string original;
  string original_00;
  shared_ptr<wallet::CWallet> *wallet_00;
  pointer psVar11;
  element_type *peVar12;
  size_type sVar13;
  size_type sVar14;
  bool bVar15;
  T *wallet_path;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  void *pvVar17;
  _Base_ptr p_Var18;
  size_type *psVar19;
  __pthread_internal_list *p_Var20;
  long *args_1;
  pointer psVar21;
  bilingual_str *this_00;
  undefined4 uVar22;
  undefined8 unaff_R15;
  long in_FS_OFFSET;
  undefined4 uVar23;
  undefined4 in_stack_fffffffffffff5ac;
  string *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  SecureString *pSVar25;
  pointer psVar26;
  undefined8 in_stack_fffffffffffff5c0;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  created_wallets;
  anon_class_40_5_0c38efe0 local_a18;
  long *local_9f0;
  shared_ptr<wallet::CWallet> local_wallet;
  long *local_9d8;
  DatabaseStatus status;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  MigrationResult local_9a8;
  undefined1 local_930 [16];
  undefined1 local_920 [24];
  _Head_base<0UL,_wallet::WalletDatabase_*,_false> local_908;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_900;
  bilingual_str local_8f0;
  undefined1 local_8b0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  DatabaseStatus status_1;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings_1;
  path local_800;
  path local_7d8;
  path temp_backup_location;
  path local_788;
  set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_> wallet_dirs;
  undefined1 local_730 [64];
  __pthread_internal_list *local_6f0 [2];
  __pthread_internal_list local_6e0;
  undefined1 local_6d0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a0;
  string local_690 [16];
  __pthread_internal_list local_680;
  bilingual_str local_670;
  bool *local_630;
  undefined8 local_628;
  bool local_620 [8];
  CAmount CStack_618;
  undefined1 local_610 [32];
  path local_5f0;
  path backup_path;
  path backup_filename;
  path local_578;
  path this_wallet_dir;
  undefined1 *local_528;
  undefined8 local_520;
  undefined1 local_518;
  undefined7 uStack_517;
  undefined8 uStack_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  long *local_4c8;
  long local_4c0;
  long local_4b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_428;
  undefined8 local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_408;
  undefined8 local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  long *local_3e8;
  long local_3e0;
  long local_3d8 [2];
  shared_ptr<wallet::CWallet> wallet;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_3a8;
  size_type local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  long *local_388;
  long local_380;
  long local_378 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  undefined8 local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  undefined8 local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined1 local_2a8 [24];
  basic_string<char,_std::char_traits<char>,_secure_allocator<char>_> local_290;
  undefined2 local_270;
  bool local_26e;
  int64_t local_268;
  WalletContext empty_context;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  undefined8 uStack_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  bilingual_str local_1b0;
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined8 uStack_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  bilingual_str error;
  MigrationResult res;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  res.wallet_name._M_dataplus._M_p = (pointer)&res.wallet_name.field_2;
  res.wallet_name._M_string_length = 0;
  res.wallet_name.field_2._M_local_buf[0] = '\0';
  res.wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  res.wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  res.watchonly_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  res.watchonly_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  res.solvables_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  res.solvables_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::path::path(&res.backup_path.super_path);
  error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  GetWallet((wallet *)&wallet,context,wallet_name);
  if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    GetWalletPath((Result<fs::path> *)&empty_context,wallet_name);
    if ((char)empty_context.wallets.
              super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\x01') {
      wallet_path = util::Result<fs::path>::value((Result<fs::path> *)&empty_context);
      BDBDataFile((path *)local_2a8,wallet_path);
      bVar15 = IsBDBFile((path *)local_2a8);
      std::filesystem::__cxx11::path::~path((path *)local_2a8);
      if (!bVar15) {
        local_1f0 = &local_1e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"Error: This wallet is already a descriptor wallet","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"Error: This wallet is already a descriptor wallet","");
        }
        else {
          local_2a8[0] = true;
          local_2a8[1] = true;
          local_2a8._2_2_ = 0x85;
          local_2a8._4_4_ = BERKELEY;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_1d0,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_2a8);
        }
        paVar16 = &local_1d0.field_2;
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
        if (local_1f0 == &local_1e0) {
          *puVar1 = CONCAT71(uStack_1df,local_1e0);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18)
               = uStack_1d8;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = local_1f0;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                            _M_u + 0x10) = CONCAT71(uStack_1df,local_1e0);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
             local_1e8;
        local_1e8 = 0;
        local_1e0 = 0;
        psVar19 = (size_type *)
                  ((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                  + 0x30);
        *(size_type **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
             psVar19;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p == paVar16) {
          *psVar19 = local_1d0.field_2._M_allocated_capacity;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38)
               = local_1d0.field_2._8_8_;
        }
        else {
          *(pointer *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20)
               = local_1d0._M_dataplus._M_p;
          *(size_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x30)
               = local_1d0.field_2._M_allocated_capacity;
        }
        pbVar24 = &local_1d0;
        local_1f0 = &local_1e0;
        goto LAB_0053df41;
      }
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_fs::path>::~_Variant_storage
                ((_Variant_storage<false,_bilingual_str,_fs::path> *)&empty_context);
      bVar15 = true;
    }
    else {
      util::ErrorString<fs::path>(&local_1b0,(Result<fs::path> *)&empty_context);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
      paVar3 = &local_1b0.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.original._M_dataplus._M_p == paVar3) {
        *puVar1 = CONCAT71(local_1b0.original.field_2._M_allocated_capacity._1_7_,
                           local_1b0.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18) =
             local_1b0.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
             local_1b0.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                  + 0x10) =
             CONCAT71(local_1b0.original.field_2._M_allocated_capacity._1_7_,
                      local_1b0.original.field_2._M_local_buf[0]);
      }
      paVar16 = &local_1b0.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
           local_1b0.original._M_string_length;
      local_1b0.original._M_dataplus._M_p = (pointer)paVar3;
      local_1b0.original._M_string_length = 0;
      local_1b0.original.field_2._M_local_buf[0] = '\0';
      psVar19 = (size_type *)
                ((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                0x30);
      *(size_type **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
           psVar19;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.translated._M_dataplus._M_p == paVar16) {
        *psVar19 = local_1b0.translated.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38) =
             local_1b0.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
             local_1b0.translated._M_dataplus._M_p;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x30) =
             local_1b0.translated.field_2._M_allocated_capacity;
      }
      pbVar24 = &local_1b0.translated;
LAB_0053df41:
      psVar19 = &pbVar24->_M_string_length;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
           *psVar19;
      (((string *)(psVar19 + -1))->_M_dataplus)._M_p = (pointer)paVar16;
      *psVar19 = 0;
      bVar15 = false;
      paVar16->_M_local_buf[0] = '\0';
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_fs::path>::~_Variant_storage
                ((_Variant_storage<false,_bilingual_str,_fs::path> *)&empty_context);
    }
    uVar22 = 0;
  }
  else {
    if ((((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
      bVar15 = RemoveWallet(context,&wallet,(optional<bool>)0x0,&warnings);
      if (bVar15) {
        bVar15 = true;
        WaitForDeleteWallet(&wallet);
        uVar22 = (undefined4)CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
        goto LAB_0053df6b;
      }
      local_170 = &local_160;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,"Unable to unload the wallet before migrating","");
      paVar3 = &local_150.field_2;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_150._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"Unable to unload the wallet before migrating","");
      }
      else {
        empty_context.chain = (Chain *)anon_var_dwarf_1d748e4;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_150,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&empty_context);
      }
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
      if (local_170 == &local_160) {
        *puVar1 = CONCAT71(uStack_15f,local_160);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18) =
             uStack_158;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = local_170;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                  + 0x10) = CONCAT71(uStack_15f,local_160);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
           local_168;
      local_168 = 0;
      local_160 = 0;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
           puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p == paVar3) {
        *puVar1 = CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                           local_150.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38) =
             local_150.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
             local_150._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                  + 0x30) =
             CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                      local_150.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
           local_150._M_string_length;
      local_150._M_string_length = 0;
      local_150.field_2._M_local_buf[0] = '\0';
      local_170 = &local_160;
      local_150._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"Error: This wallet is already a descriptor wallet","");
      paVar3 = &local_110.field_2;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_110._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"Error: This wallet is already a descriptor wallet","");
      }
      else {
        empty_context.chain = (Chain *)anon_var_dwarf_1d748d7;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_110,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&empty_context);
      }
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
      if (local_130 == &local_120) {
        *puVar1 = CONCAT71(uStack_11f,local_120);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18) =
             uStack_118;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = local_130;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                  + 0x10) = CONCAT71(uStack_11f,local_120);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
           local_128;
      local_128 = 0;
      local_120 = 0;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
           puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == paVar3) {
        *puVar1 = CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                           local_110.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38) =
             local_110.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
             local_110._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                  + 0x30) =
             CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                      local_110.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
           local_110._M_string_length;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      local_130 = &local_120;
      local_110._M_dataplus._M_p = (pointer)paVar3;
    }
    bVar15 = false;
    (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::MigrationResult>.
    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
    super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
    uVar22 = 0;
  }
LAB_0053df6b:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._1_7_,
               wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._0_1_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._1_7_,
                        wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_1_));
  }
  if (!bVar15) goto LAB_0053fb8c;
  WalletContext::WalletContext(&empty_context);
  empty_context.args = context->args;
  local_2a8._16_8_ = (long *)0x0;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  local_270._0_1_ = true;
  local_270._1_1_ = false;
  local_26e = false;
  local_268 = 100;
  local_2a8[0] = true;
  local_2a8[1] = false;
  local_2a8._4_4_ = BERKELEY_RO;
  local_2a8._8_4_ = 1;
  MakeWalletDatabase((wallet *)&local_9d8,wallet_name,(DatabaseOptions *)local_2a8,&status,&error);
  if (local_9d8 == (long *)0x0) {
    local_388 = local_378;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_388,"Wallet file verification failed.","");
    paVar3 = &local_368.field_2;
    local_368._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,local_388,local_380 + (long)local_388);
    paVar16 = &local_348.field_2;
    local_348._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_388,local_380 + (long)local_388);
    local_3e8 = local_3d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8," ","");
    wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_3b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&wallet,local_3e8,local_3e0 + (long)local_3e8);
    local_3a8._M_head_impl = (_Impl *)&local_398;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a8,local_3e8,local_3e0 + (long)local_3e8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_368,
               (char *)wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._1_7_,
                         wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._0_1_));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_348,(char *)local_3a8._M_head_impl,local_3a0);
    paVar4 = &local_328.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p == paVar3) {
      local_328.field_2._8_8_ = local_368.field_2._8_8_;
      local_328._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_328._M_dataplus._M_p = local_368._M_dataplus._M_p;
    }
    local_328.field_2._M_allocated_capacity._1_7_ = local_368.field_2._M_allocated_capacity._1_7_;
    local_328.field_2._M_local_buf[0] = local_368.field_2._M_local_buf[0];
    paVar5 = &local_308.field_2;
    local_328._M_string_length = local_368._M_string_length;
    local_368._M_string_length = 0;
    local_368.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p == paVar16) {
      local_308.field_2._8_8_ = local_348.field_2._8_8_;
      local_308._M_dataplus._M_p = (pointer)paVar5;
    }
    else {
      local_308._M_dataplus._M_p = local_348._M_dataplus._M_p;
    }
    local_308.field_2._M_allocated_capacity._1_7_ = local_348.field_2._M_allocated_capacity._1_7_;
    local_308.field_2._M_local_buf[0] = local_348.field_2._M_local_buf[0];
    local_308._M_string_length = local_348._M_string_length;
    local_348._M_string_length = 0;
    local_348.field_2._M_local_buf[0] = '\0';
    local_368._M_dataplus._M_p = (pointer)paVar3;
    local_348._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_328,error.original._M_dataplus._M_p,error.original._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_308,error.translated._M_dataplus._M_p,error.translated._M_string_length);
    local_2b8._M_allocated_capacity = local_308.field_2._M_allocated_capacity;
    sVar14 = local_308._M_string_length;
    local_2d8._M_allocated_capacity = local_328.field_2._M_allocated_capacity;
    sVar13 = local_328._M_string_length;
    local_2e8 = &local_2d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p == paVar4) {
      local_2d8._8_8_ = local_328.field_2._8_8_;
      local_328._M_dataplus._M_p = (pointer)local_2e8;
    }
    local_2c8 = &local_2b8;
    local_328._M_string_length = 0;
    local_328.field_2._M_allocated_capacity =
         local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p == paVar5) {
      local_2b8._8_8_ = local_308.field_2._8_8_;
      local_308._M_dataplus._M_p = (pointer)local_2c8;
    }
    local_308._M_string_length = 0;
    local_308.field_2._M_allocated_capacity =
         local_308.field_2._M_allocated_capacity & 0xffffffffffffff00;
    puVar2 = (ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                              _M_u + 0x10);
    *(ulong **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p == local_2e8) {
      *puVar2 = local_2d8._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18) =
           local_2d8._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
           local_328._M_dataplus._M_p;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x10) =
           local_2d8._M_allocated_capacity;
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) = sVar13
    ;
    local_2e0 = 0;
    local_2d8._M_allocated_capacity = local_2d8._M_allocated_capacity & 0xffffffffffffff00;
    puVar2 = (ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                              _M_u + 0x30);
    *(ulong **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
         puVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p == local_2c8) {
      *puVar2 = local_2b8._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38) =
           local_2b8._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
           local_308._M_dataplus._M_p;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x30) =
           local_2b8._M_allocated_capacity;
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
         sVar14;
    local_2c0 = 0;
    local_2b8._M_allocated_capacity = local_2b8._M_allocated_capacity & 0xffffffffffffff00;
    (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::MigrationResult>.
    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
    super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
    local_328._M_dataplus._M_p = (pointer)paVar4;
    local_308._M_dataplus._M_p = (pointer)paVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_head_impl != &local_398) {
      operator_delete(local_3a8._M_head_impl,local_398._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        &local_3b8) {
      operator_delete(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_3b8._M_allocated_capacity + 1);
    }
    if (local_3e8 != local_3d8) {
      operator_delete(local_3e8,local_3d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar16) {
      operator_delete(local_348._M_dataplus._M_p,
                      CONCAT71(local_348.field_2._M_allocated_capacity._1_7_,
                               local_348.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar3) {
      operator_delete(local_368._M_dataplus._M_p,
                      CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                               local_368.field_2._M_local_buf[0]) + 1);
    }
    if (local_388 != local_378) {
      operator_delete(local_388,local_378[0] + 1);
    }
  }
  else {
    local_9f0 = local_9d8;
    local_9d8 = (long *)0x0;
    args_1 = (long *)local_2a8._16_8_;
    CWallet::Create((CWallet *)&local_wallet,&empty_context,wallet_name,
                    (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                     )&local_9f0,local_2a8._16_8_,&error,&warnings);
    if (local_9f0 != (long *)0x0) {
      (**(code **)(*local_9f0 + 8))();
    }
    local_9f0 = (long *)0x0;
    if (local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      local_4c8 = local_4b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4c8,"Wallet loading failed.","");
      paVar3 = &local_4a8.field_2;
      local_4a8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a8,local_4c8,local_4c0 + (long)local_4c8);
      paVar16 = &local_488.field_2;
      local_488._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_488,local_4c8,local_4c0 + (long)local_4c8);
      local_4e8 = local_4d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8," ","");
      wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_3b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&wallet,local_4e8,local_4e0 + (long)local_4e8);
      local_3a8._M_head_impl = (_Impl *)&local_398;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3a8,local_4e8,local_4e0 + (long)local_4e8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_4a8,
                 (char *)wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,
                 CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._1_7_,
                          wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._0_1_));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_488,(char *)local_3a8._M_head_impl,local_3a0);
      paVar4 = &local_468.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p == paVar3) {
        local_468.field_2._8_8_ = local_4a8.field_2._8_8_;
        local_468._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_468._M_dataplus._M_p = local_4a8._M_dataplus._M_p;
      }
      local_468.field_2._M_allocated_capacity._1_7_ = local_4a8.field_2._M_allocated_capacity._1_7_;
      local_468.field_2._M_local_buf[0] = local_4a8.field_2._M_local_buf[0];
      paVar5 = &local_448.field_2;
      local_468._M_string_length = local_4a8._M_string_length;
      local_4a8._M_string_length = 0;
      local_4a8.field_2._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p == paVar16) {
        local_448.field_2._8_8_ = local_488.field_2._8_8_;
        local_448._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_448._M_dataplus._M_p = local_488._M_dataplus._M_p;
      }
      local_448.field_2._M_allocated_capacity._1_7_ = local_488.field_2._M_allocated_capacity._1_7_;
      local_448.field_2._M_local_buf[0] = local_488.field_2._M_local_buf[0];
      local_448._M_string_length = local_488._M_string_length;
      local_488._M_string_length = 0;
      local_488.field_2._M_local_buf[0] = '\0';
      local_4a8._M_dataplus._M_p = (pointer)paVar3;
      local_488._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_468,error.original._M_dataplus._M_p,error.original._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_448,error.translated._M_dataplus._M_p,error.translated._M_string_length);
      local_3f8._M_allocated_capacity = local_448.field_2._M_allocated_capacity;
      sVar14 = local_448._M_string_length;
      local_418._M_allocated_capacity = local_468.field_2._M_allocated_capacity;
      sVar13 = local_468._M_string_length;
      local_428 = &local_418;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p == paVar4) {
        local_418._8_8_ = local_468.field_2._8_8_;
        local_468._M_dataplus._M_p = (pointer)local_428;
      }
      local_408 = &local_3f8;
      local_468._M_string_length = 0;
      local_468.field_2._M_allocated_capacity =
           local_468.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p == paVar5) {
        local_3f8._8_8_ = local_448.field_2._8_8_;
        local_448._M_dataplus._M_p = (pointer)local_408;
      }
      local_448._M_string_length = 0;
      local_448.field_2._M_allocated_capacity =
           local_448.field_2._M_allocated_capacity & 0xffffffffffffff00;
      puVar2 = (ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                ._M_u + 0x10);
      *(ulong **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p == local_428) {
        *puVar2 = local_418._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18) =
             local_418._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
             local_468._M_dataplus._M_p;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x10) =
             local_418._M_allocated_capacity;
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
           sVar13;
      local_420 = 0;
      local_418._M_allocated_capacity = local_418._M_allocated_capacity & 0xffffffffffffff00;
      puVar2 = (ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                ._M_u + 0x30);
      *(ulong **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
           puVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p == local_408) {
        *puVar2 = local_3f8._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38) =
             local_3f8._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
             local_448._M_dataplus._M_p;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x30) =
             local_3f8._M_allocated_capacity;
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
           sVar14;
      local_400 = 0;
      local_3f8._M_allocated_capacity = local_3f8._M_allocated_capacity & 0xffffffffffffff00;
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
      local_468._M_dataplus._M_p = (pointer)paVar4;
      local_448._M_dataplus._M_p = (pointer)paVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_head_impl != &local_398) {
        operator_delete(local_3a8._M_head_impl,local_398._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_3b8) {
        operator_delete(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_3b8._M_allocated_capacity + 1);
      }
      if (local_4e8 != local_4d8) {
        operator_delete(local_4e8,local_4d8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != paVar16) {
        operator_delete(local_488._M_dataplus._M_p,
                        CONCAT71(local_488.field_2._M_allocated_capacity._1_7_,
                                 local_488.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != paVar3) {
        operator_delete(local_4a8._M_dataplus._M_p,
                        CONCAT71(local_4a8.field_2._M_allocated_capacity._1_7_,
                                 local_4a8.field_2._M_local_buf[0]) + 1);
      }
      if (local_4c8 != local_4b8) {
        operator_delete(local_4c8,local_4b8[0] + 1);
      }
    }
    else {
      local_a18.options = (DatabaseOptions *)local_2a8;
      local_a18.context = context;
      local_a18.status = &status;
      local_a18.error = &error;
      local_a18.warnings = &warnings;
      if ((((local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
        pWVar8 = ((local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_database)._M_t.
                 super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                 .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
        if (pWVar8 == (WalletDatabase *)0x0) goto LAB_0053fcef;
        (*pWVar8->_vptr_WalletDatabase[0xc])(&backup_path);
        __str = wallet_name;
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)&wallet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&backup_path
                   ,auto_format);
        std::filesystem::__cxx11::path::path(&backup_filename.super_path,(path *)&wallet);
        std::filesystem::__cxx11::path::~path((path *)&wallet);
        std::filesystem::absolute((path *)&wallet);
        std::filesystem::__cxx11::path::path((path *)&wallet_dirs,(path *)&wallet);
        std::filesystem::__cxx11::path::~path((path *)&wallet);
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::__cxx11::path::path(&this_wallet_dir.super_path,&local_578);
        std::filesystem::__cxx11::path::~path(&local_578);
        std::filesystem::__cxx11::path::~path((path *)&wallet_dirs);
        std::filesystem::__cxx11::path::~path(&backup_filename.super_path);
        paVar3 = &backup_path.super_path._M_pathname.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)backup_path.super_path._M_pathname._M_dataplus._M_p != paVar3) {
          operator_delete(backup_path.super_path._M_pathname._M_dataplus._M_p,
                          backup_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
        }
        backup_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar3;
        if (wallet_name->_M_string_length == 0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&backup_path,"default_wallet","");
        }
        else {
          pcVar9 = (wallet_name->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&backup_path,pcVar9,pcVar9 + wallet_name->_M_string_length);
        }
        temp_backup_location.super_path._M_pathname._M_dataplus._M_p = (pointer)GetTime();
        tinyformat::format<std::__cxx11::string,long>
                  ((string *)&wallet_dirs,(tinyformat *)"%s_%d.legacy.bak",(char *)&backup_path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &temp_backup_location,args_1);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)&wallet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wallet_dirs
                   ,auto_format);
        std::filesystem::__cxx11::path::path(&backup_filename.super_path,(path *)&wallet);
        std::filesystem::__cxx11::path::~path((path *)&wallet);
        if ((_Base_ptr *)wallet_dirs._M_t._M_impl._0_8_ !=
            &wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)wallet_dirs._M_t._M_impl._0_8_,
                          (ulong)((long)&(wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)backup_path.super_path._M_pathname._M_dataplus._M_p != paVar3) {
          operator_delete(backup_path.super_path._M_pathname._M_dataplus._M_p,
                          backup_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::path(&local_5f0,&this_wallet_dir.super_path);
        std::filesystem::__cxx11::path::operator/=(&local_5f0,(path *)&backup_filename);
        std::filesystem::__cxx11::path::path(&backup_path.super_path,&local_5f0);
        std::filesystem::__cxx11::path::~path(&local_5f0);
        peVar12 = local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_3b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&wallet,backup_path.super_path._M_pathname._M_dataplus._M_p,
                   backup_path.super_path._M_pathname._M_dataplus._M_p +
                   backup_path.super_path._M_pathname._M_string_length);
        bVar15 = CWallet::BackupWallet(peVar12,(string *)&wallet);
        uVar23 = uVar22;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_3b8) {
          operator_delete(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,local_3b8._M_allocated_capacity + 1);
        }
        if (bVar15) {
          pbVar24 = __str;
          std::filesystem::__cxx11::path::operator=
                    (&res.backup_path.super_path,(path *)&backup_path);
          bVar15 = CWallet::IsLocked(local_wallet.
                                     super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
          if ((!bVar15) ||
             (pSVar25 = passphrase,
             bVar15 = CWallet::Unlock(local_wallet.
                                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,passphrase), bVar15)) {
            wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 &(local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->cs_wallet;
            wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ._0_1_ = 0;
            std::unique_lock<std::recursive_mutex>::lock
                      ((unique_lock<std::recursive_mutex> *)&wallet);
            bVar15 = CWallet::MigrateToSQLite
                               (local_wallet.
                                super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,&error);
            if (bVar15) {
              if ((((local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x21 & 1) ==
                  0) {
                bVar15 = DoMigration(local_wallet.
                                     super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,context,&error,&res);
              }
              else {
                bVar15 = true;
                CWallet::SetWalletFlag
                          (local_wallet.
                           super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           0x400000000);
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)&wallet);
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              if (bVar15 == false) {
LAB_0053f3b6:
                GetWalletDir();
                fsbridge::AbsPathJoin(&temp_backup_location,(path *)&wallet,&backup_filename);
                std::filesystem::__cxx11::path::~path((path *)&wallet);
                std::filesystem::copy_file((path *)&backup_path,(path *)&temp_backup_location,none);
                created_wallets.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                created_wallets.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                created_wallets.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  std::
                  vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                  ::emplace_back<std::shared_ptr<wallet::CWallet>>
                            ((vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                              *)&created_wallets,&local_wallet);
                }
                if (res.watchonly_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  std::
                  vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                  ::emplace_back<std::shared_ptr<wallet::CWallet>>
                            ((vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                              *)&created_wallets,
                             (shared_ptr<wallet::CWallet> *)&res.watchonly_wallet);
                }
                if (res.solvables_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  std::
                  vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                  ::emplace_back<std::shared_ptr<wallet::CWallet>>
                            ((vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                              *)&created_wallets,
                             (shared_ptr<wallet::CWallet> *)&res.solvables_wallet);
                }
                if (created_wallets.
                    super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    created_wallets.
                    super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  psVar21 = created_wallets.
                            super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  psVar26 = created_wallets.
                            super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  do {
                    _Var10.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
                         (((psVar21->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->m_database)._M_t.
                         super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                         .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>;
                    if (_Var10.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl
                        == (WalletDatabase *)0x0) goto LAB_0053fcef;
                    (**(code **)(*(long *)_Var10.
                                          super__Head_base<0UL,_wallet::WalletDatabase_*,_false>.
                                          _M_head_impl + 0x60))(&local_870);
                    std::filesystem::__cxx11::path::
                    path<std::__cxx11::string,std::filesystem::__cxx11::path>
                              ((path *)&wallet,&local_870,auto_format);
                    std::filesystem::__cxx11::path::path((path *)&status_1,(path *)&wallet);
                    std::filesystem::__cxx11::path::~path((path *)&wallet);
                    std::filesystem::__cxx11::path::parent_path();
                    std::
                    _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                    ::_M_emplace_unique<std::filesystem::__cxx11::path>
                              (&wallet_dirs._M_t,(path *)&warnings_1);
                    std::filesystem::__cxx11::path::~path((path *)&warnings_1);
                    std::filesystem::__cxx11::path::~path((path *)&status_1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_870._M_dataplus._M_p != &local_870.field_2) {
                      operator_delete(local_870._M_dataplus._M_p,
                                      (ulong)(local_870.field_2._M_allocated_capacity + 1));
                    }
                    psVar11 = created_wallets.
                              super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    psVar21 = psVar21 + 1;
                    wallet_00 = (shared_ptr<wallet::CWallet> *)
                                created_wallets.
                                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                  } while (psVar21 != psVar26);
                  for (; wallet_00 != (shared_ptr<wallet::CWallet> *)psVar11;
                      wallet_00 = wallet_00 + 1) {
                    if (((wallet_00->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->m_chain == (Chain *)0x0) {
                      this = (wallet_00->
                             super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                             _M_refcount._M_pi;
                      if ((this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                         (this->_M_use_count != 1)) {
                        __assert_fail("w.use_count() == 1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                                      ,0x11bf,
                                      "util::Result<MigrationResult> wallet::MigrateLegacyToDescriptor(const std::string &, const SecureString &, WalletContext &)"
                                     );
                      }
                      (wallet_00->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr = (element_type *)0x0;
                      (wallet_00->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                    }
                    else {
                      bVar15 = RemoveWallet(context,wallet_00,(optional<bool>)0x100);
                      if (!bVar15) {
                        _((bilingual_str *)&wallet,(ConstevalStringLiteral)0x85aec3);
                        bilingual_str::operator+=(&error,(bilingual_str *)&wallet);
                        bilingual_str::~bilingual_str((bilingual_str *)&wallet);
                        bilingual_str::bilingual_str((bilingual_str *)local_8b0,&error);
                        puVar1 = (undefined8 *)
                                 ((long)&(__return_storage_ptr__->m_variant).
                                         super__Variant_base<bilingual_str,_wallet::MigrationResult>
                                         .
                                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                         .
                                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                         .
                                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                         .
                                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                         .
                                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                         ._M_u + 0x10);
                        *(undefined8 **)
                         &(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                             puVar1;
                        if ((undefined1 *)local_8b0._0_8_ == local_8b0 + 0x10) {
                          *puVar1 = CONCAT71(local_8b0._17_7_,local_8b0[0x10]);
                          *(undefined8 *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                   ._M_u + 0x18) = local_8b0._24_8_;
                        }
                        else {
                          *(undefined8 *)
                           &(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                               local_8b0._0_8_;
                          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                            super__Variant_base<bilingual_str,_wallet::MigrationResult>
                                            .
                                            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                            .
                                            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                            .
                                            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                            .
                                            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                            .
                                            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                            ._M_u + 0x10) =
                               CONCAT71(local_8b0._17_7_,local_8b0[0x10]);
                        }
                        *(undefined8 *)
                         ((long)&(__return_storage_ptr__->m_variant).
                                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                 ._M_u + 8) = local_8b0._8_8_;
                        local_8b0._8_8_ = 0;
                        local_8b0[0x10] = _S_red;
                        puVar1 = (undefined8 *)
                                 ((long)&(__return_storage_ptr__->m_variant).
                                         super__Variant_base<bilingual_str,_wallet::MigrationResult>
                                         .
                                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                         .
                                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                         .
                                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                         .
                                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                         .
                                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                         ._M_u + 0x30);
                        *(undefined8 **)
                         ((long)&(__return_storage_ptr__->m_variant).
                                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                 ._M_u + 0x20) = puVar1;
                        if ((_Base_ptr)local_8b0._32_8_ == (_Base_ptr)(local_8b0 + 0x30)) {
                          *puVar1 = CONCAT71(local_8b0._49_7_,local_8b0[0x30]);
                          *(undefined8 *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                   ._M_u + 0x38) = local_8b0._56_8_;
                        }
                        else {
                          *(undefined8 *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                   ._M_u + 0x20) = local_8b0._32_8_;
                          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                            super__Variant_base<bilingual_str,_wallet::MigrationResult>
                                            .
                                            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                            .
                                            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                            .
                                            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                            .
                                            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                            .
                                            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                            ._M_u + 0x30) =
                               CONCAT71(local_8b0._49_7_,local_8b0[0x30]);
                        }
                        *(undefined8 *)
                         ((long)&(__return_storage_ptr__->m_variant).
                                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                 ._M_u + 0x28) = local_8b0._40_8_;
                        local_8b0._40_8_ = (_Base_ptr)0x0;
                        local_8b0[0x30] = '\0';
                        (__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                        _M_index = '\0';
                        local_8b0._0_8_ = local_8b0 + 0x10;
                        local_8b0._32_8_ = (_Base_ptr)(local_8b0 + 0x30);
                        util::Error::~Error((Error *)local_8b0);
                        goto LAB_0053fa50;
                      }
                      WaitForDeleteWallet(wallet_00);
                    }
                  }
                }
                for (p_Var18 = wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var18 != &wallet_dirs._M_t._M_impl.super__Rb_tree_header;
                    p_Var18 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var18)) {
                  std::filesystem::remove_all((path *)(p_Var18 + 1));
                }
                warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl
                .super__Vector_impl_data._M_start = (pointer)0x0;
                warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl
                .super__Vector_impl_data._M_finish = (pointer)0x0;
                warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                RestoreWallet((wallet *)&wallet,context,&temp_backup_location,pbVar24,
                              (optional<bool>)0x0,&status_1,&error,&warnings_1);
                peVar12 = wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             CONCAT71(wallet.
                                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi._1_7_,
                                      wallet.
                                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi._0_1_));
                }
                if (peVar12 == (element_type *)0x0) {
                  _((bilingual_str *)&wallet,(ConstevalStringLiteral)0x85af76);
                  bilingual_str::operator+=(&error,(bilingual_str *)&wallet);
                  bilingual_str::~bilingual_str((bilingual_str *)&wallet);
                  this_00 = &local_8f0;
                  bilingual_str::bilingual_str(this_00,&error);
                  puVar1 = (undefined8 *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                   ._M_u + 0x10);
                  *(undefined8 **)
                   &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
                  paVar3 = &local_8f0.original.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_8f0.original._M_dataplus._M_p == paVar3) {
                    *puVar1 = CONCAT71(local_8f0.original.field_2._M_allocated_capacity._1_7_,
                                       local_8f0.original.field_2._M_local_buf[0]);
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x18) = local_8f0.original.field_2._8_8_;
                  }
                  else {
                    *(pointer *)
                     &(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                         local_8f0.original._M_dataplus._M_p;
                    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                      ._M_u + 0x10) =
                         CONCAT71(local_8f0.original.field_2._M_allocated_capacity._1_7_,
                                  local_8f0.original.field_2._M_local_buf[0]);
                  }
                  paVar16 = &local_8f0.translated.field_2;
                  *(size_type *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 8) = local_8f0.original._M_string_length;
                  local_8f0.original._M_string_length = 0;
                  local_8f0.original.field_2._M_local_buf[0] = '\0';
                  psVar19 = (size_type *)
                            ((long)&(__return_storage_ptr__->m_variant).
                                    super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                    .
                                    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                    .super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                    ._M_u + 0x30);
                  *(size_type **)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 0x20) = psVar19;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_8f0.translated._M_dataplus._M_p == paVar16) {
                    *psVar19 = local_8f0.translated.field_2._M_allocated_capacity;
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x38) = local_8f0.translated.field_2._8_8_;
                  }
                  else {
                    *(pointer *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x20) = local_8f0.translated._M_dataplus._M_p;
                    *(size_type *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x30) = local_8f0.translated.field_2._M_allocated_capacity;
                  }
                  *(size_type *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 0x28) = local_8f0.translated._M_string_length;
                  local_8f0.original._M_dataplus._M_p = (pointer)paVar3;
                  local_8f0.translated._M_dataplus._M_p = (pointer)paVar16;
                }
                else {
                  std::filesystem::copy_file
                            ((path *)&temp_backup_location,(path *)&backup_path,none);
                  std::filesystem::remove((path *)&temp_backup_location);
                  this_00 = (bilingual_str *)local_930;
                  bilingual_str::bilingual_str(this_00,&error);
                  puVar1 = (undefined8 *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                   ._M_u + 0x10);
                  *(undefined8 **)
                   &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
                  if ((Chain *)local_930._0_8_ == (Chain *)local_920) {
                    *puVar1 = CONCAT71(local_920._1_7_,local_920[0]);
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x18) = local_920._8_8_;
                  }
                  else {
                    *(undefined8 *)
                     &(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                         local_930._0_8_;
                    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                      ._M_u + 0x10) = CONCAT71(local_920._1_7_,local_920[0]);
                  }
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 8) = local_930._8_8_;
                  local_930._8_8_ = (pointer)0x0;
                  local_920[0] = '\0';
                  psVar19 = (size_type *)
                            ((long)&(__return_storage_ptr__->m_variant).
                                    super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                    .
                                    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                    .super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                    ._M_u + 0x30);
                  *(size_type **)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 0x20) = psVar19;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_920._16_8_ == &local_900) {
                    *psVar19 = local_900._M_allocated_capacity;
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x38) = local_900._8_8_;
                  }
                  else {
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x20) = local_920._16_8_;
                    *(size_type *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x30) = local_900._M_allocated_capacity;
                  }
                  *(WalletDatabase **)
                   ((__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u.
                    _M_first._M_storage._M_storage + 0x28) = local_908._M_head_impl;
                  local_930._0_8_ = (Chain *)local_920;
                  local_920._16_8_ = &local_900;
                }
                (this_00->translated)._M_string_length = 0;
                (this_00->translated).field_2._M_local_buf[0] = '\0';
                (__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0'
                ;
                util::Error::~Error((Error *)this_00);
                std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&warnings_1);
LAB_0053fa50:
                _GLOBAL__N_1::std::
                vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ::~vector((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                           *)&created_wallets);
                std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
              }
              else {
                pWVar8 = ((local_wallet.
                           super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         m_database)._M_t.
                         super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                         .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
                if (pWVar8 == (WalletDatabase *)0x0) goto LAB_0053fcef;
                (*pWVar8->_vptr_WalletDatabase[0xc])(&warnings_1);
                fs::PathFromString(&temp_backup_location,(string *)&warnings_1);
                std::filesystem::__cxx11::path::parent_path();
                std::filesystem::__cxx11::path::path((path *)&wallet,&local_788);
                std::
                _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                ::_M_insert_unique<fs::path>(&wallet_dirs._M_t,(path *)&wallet);
                std::filesystem::__cxx11::path::~path((path *)&wallet);
                std::filesystem::__cxx11::path::~path(&local_788);
                std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
                ppbVar6 = &warnings_1.
                           super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
                if (warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar6) {
                  operator_delete(warnings_1.
                                  super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (ulong)((long)&((warnings_1.
                                                                                                      
                                                  super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->original)._M_dataplus._M_p + 1));
                }
                bVar15 = MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                                   (&local_a18,&local_wallet);
                res.wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &res.wallet.
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                           &local_wallet.
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                          __str);
                if (!bVar15) goto LAB_0053f3b6;
                if (res.watchonly_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  pWVar8 = ((res.watchonly_wallet.
                             super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->m_database)._M_t.
                           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
                  if (pWVar8 == (WalletDatabase *)0x0) goto LAB_0053fcef;
                  (*pWVar8->_vptr_WalletDatabase[0xc])(&warnings_1);
                  fs::PathFromString(&temp_backup_location,(string *)&warnings_1);
                  std::filesystem::__cxx11::path::parent_path();
                  std::filesystem::__cxx11::path::path((path *)&wallet,&local_7d8);
                  std::
                  _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                  ::_M_insert_unique<fs::path>(&wallet_dirs._M_t,(path *)&wallet);
                  std::filesystem::__cxx11::path::~path((path *)&wallet);
                  std::filesystem::__cxx11::path::~path(&local_7d8);
                  std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
                  if (warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar6) {
                    operator_delete(warnings_1.
                                    super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (ulong)((long)&((warnings_1.
                                                                                                          
                                                  super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->original)._M_dataplus._M_p + 1));
                  }
                  bVar15 = MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                                     (&local_a18,
                                      (shared_ptr<wallet::CWallet> *)&res.watchonly_wallet);
                  if (!bVar15) goto LAB_0053f3b6;
                }
                if (res.solvables_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  pWVar8 = ((res.solvables_wallet.
                             super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->m_database)._M_t.
                           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
                  if (pWVar8 == (WalletDatabase *)0x0) {
LAB_0053fcef:
                    __assert_fail("static_cast<bool>(m_database)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                                  ,0x1be,
                                  "virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
                  }
                  (*pWVar8->_vptr_WalletDatabase[0xc])(&warnings_1);
                  fs::PathFromString(&temp_backup_location,(string *)&warnings_1);
                  std::filesystem::__cxx11::path::parent_path();
                  std::filesystem::__cxx11::path::path((path *)&wallet,&local_800);
                  std::
                  _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                  ::_M_insert_unique<fs::path>(&wallet_dirs._M_t,(path *)&wallet);
                  std::filesystem::__cxx11::path::~path((path *)&wallet);
                  std::filesystem::__cxx11::path::~path(&local_800);
                  std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
                  if (warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar6) {
                    operator_delete(warnings_1.
                                    super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (ulong)((long)&((warnings_1.
                                                                                                          
                                                  super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->original)._M_dataplus._M_p + 1));
                  }
                  bVar15 = MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                                     (&local_a18,
                                      (shared_ptr<wallet::CWallet> *)&res.solvables_wallet);
                  if (!bVar15) goto LAB_0053f3b6;
                }
                MigrationResult::MigrationResult(&local_9a8,&res);
                std::__detail::__variant::_Uninitialized<wallet::MigrationResult,_false>::
                _Uninitialized<wallet::MigrationResult>
                          ((_Uninitialized<wallet::MigrationResult,_false> *)__return_storage_ptr__,
                           &local_9a8);
                (__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index =
                     '\x01';
                MigrationResult::~MigrationResult(&local_9a8);
              }
              std::
              _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
              ::~_Rb_tree(&wallet_dirs._M_t);
            }
            else {
              bilingual_str::bilingual_str((bilingual_str *)local_730,&error);
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
              if ((undefined1 *)local_730._0_8_ == local_730 + 0x10) {
                *puVar1 = CONCAT71(local_730._17_7_,local_730[0x10]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x18) = local_730._24_8_;
              }
              else {
                *(undefined8 *)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                     local_730._0_8_;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x10) = CONCAT71(local_730._17_7_,local_730[0x10]);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8
               ) = local_730._8_8_;
              local_730._8_8_ = 0;
              local_730[0x10] = '\0';
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x20) = puVar1;
              if ((_Base_ptr)local_730._32_8_ == (_Base_ptr)(local_730 + 0x30)) {
                *puVar1 = CONCAT71(local_730._49_7_,local_730[0x30]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x38) = local_730._56_8_;
              }
              else {
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x20) = local_730._32_8_;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x30) = CONCAT71(local_730._49_7_,local_730[0x30]);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x28) = local_730._40_8_;
              local_730._40_8_ = (_Base_ptr)0x0;
              local_730[0x30] = '\0';
              (__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
              local_730._0_8_ = local_730 + 0x10;
              local_730._32_8_ = (_Base_ptr)(local_730 + 0x30);
              util::Error::~Error((Error *)local_730);
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)&wallet);
            }
          }
          else {
            if ((char)uVar22 != '\0') {
              MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                        (&local_a18,&local_wallet);
            }
            if ((passphrase->_M_string_length == 0) ||
               (__s = (passphrase->_M_dataplus)._M_p,
               pvVar17 = memchr(__s,0,passphrase->_M_string_length),
               pvVar17 == (void *)0x0 || (long)pvVar17 - (long)__s == -1)) {
              local_690._0_8_ = &local_680;
              std::__cxx11::string::_M_construct<char_const*>
                        (local_690,
                         "Error: Wallet decryption failed, the wallet passphrase was not provided or was incorrect."
                         ,"");
              original._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff5ac;
              original._M_dataplus._M_p._0_4_ = uVar23;
              original._M_string_length = (size_type)pbVar24;
              original.field_2._M_allocated_capacity = (size_type)pSVar25;
              original.field_2._8_8_ = in_stack_fffffffffffff5c0;
              Untranslated(&local_670,original);
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
              paVar3 = &local_670.original.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670.original._M_dataplus._M_p == paVar3) {
                *puVar1 = CONCAT71(local_670.original.field_2._M_allocated_capacity._1_7_,
                                   local_670.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x18) = local_670.original.field_2._8_8_;
              }
              else {
                *(pointer *)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                     local_670.original._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x10) =
                     CONCAT71(local_670.original.field_2._M_allocated_capacity._1_7_,
                              local_670.original.field_2._M_local_buf[0]);
              }
              paVar16 = &local_670.translated.field_2;
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8
               ) = local_670.original._M_string_length;
              local_670.original._M_string_length = 0;
              local_670.original.field_2._M_local_buf[0] = '\0';
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x20) = puVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670.translated._M_dataplus._M_p == paVar16) {
                *puVar1 = CONCAT71(local_670.translated.field_2._M_allocated_capacity._1_7_,
                                   local_670.translated.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x38) = local_670.translated.field_2._8_8_;
              }
              else {
                *(pointer *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x20) = local_670.translated._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x30) =
                     CONCAT71(local_670.translated.field_2._M_allocated_capacity._1_7_,
                              local_670.translated.field_2._M_local_buf[0]);
              }
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x28) = local_670.translated._M_string_length;
              local_670.translated._M_string_length = 0;
              local_670.translated.field_2._M_local_buf[0] = '\0';
              (__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
              local_670.original._M_dataplus._M_p = (pointer)paVar3;
              local_670.translated._M_dataplus._M_p = (pointer)paVar16;
              util::Error::~Error((Error *)&local_670);
              p_Var20 = (__pthread_internal_list *)local_690._0_8_;
              if ((__pthread_internal_list *)local_690._0_8_ != &local_680) goto LAB_0053fb07;
            }
            else {
              local_6f0[0] = &local_6e0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_6f0,anon_var_dwarf_1d74940,anon_var_dwarf_1d74940 + 0x138);
              original_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff5ac;
              original_00._M_dataplus._M_p._0_4_ = uVar23;
              original_00._M_string_length = (size_type)pbVar24;
              original_00.field_2._M_allocated_capacity = (size_type)pSVar25;
              original_00.field_2._8_8_ = in_stack_fffffffffffff5c0;
              Untranslated((bilingual_str *)local_6d0,original_00);
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
              if ((_Base_ptr)local_6d0._0_8_ == (_Base_ptr)(local_6d0 + 0x10)) {
                *puVar1 = CONCAT71(local_6d0._17_7_,local_6d0[0x10]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x18) = local_6d0._24_8_;
              }
              else {
                *(undefined8 *)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                     local_6d0._0_8_;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x10) = CONCAT71(local_6d0._17_7_,local_6d0[0x10]);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8
               ) = local_6d0._8_8_;
              local_6d0._8_8_ = 0;
              local_6d0[0x10] = '\0';
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x20) = puVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6d0._32_8_ == &local_6a0) {
                *puVar1 = CONCAT71(local_6a0._M_allocated_capacity._1_7_,local_6a0._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x38) = local_6a0._8_8_;
              }
              else {
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x20) = local_6d0._32_8_;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x30) =
                     CONCAT71(local_6a0._M_allocated_capacity._1_7_,local_6a0._M_local_buf[0]);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x28) = local_6d0._40_8_;
              local_6d0._40_8_ = 0;
              local_6a0._M_local_buf[0] = '\0';
              (__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
              local_6d0._0_8_ = (_Base_ptr)(local_6d0 + 0x10);
              local_6d0._32_8_ = &local_6a0;
              util::Error::~Error((Error *)local_6d0);
              local_680.__prev = local_6e0.__prev;
              p_Var20 = local_6f0[0];
              if (local_6f0[0] != &local_6e0) {
LAB_0053fb07:
                operator_delete(p_Var20,(ulong)((long)&((_Base_ptr)local_680.__prev)->_M_color + 1))
                ;
              }
            }
          }
        }
        else {
          if ((char)uVar22 != '\0') {
            MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                      (&local_a18,&local_wallet);
          }
          local_630 = local_620;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_630,"Error: Unable to make a backup of your wallet","");
          pcVar9 = local_610 + 0x10;
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_610._0_8_ = pcVar9;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_610,"Error: Unable to make a backup of your wallet","");
          }
          else {
            wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)anon_var_dwarf_1d74918;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_610,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&wallet);
          }
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
          if (local_630 == local_620) {
            *puVar1 = CONCAT71(local_620._1_7_,local_620[0]);
            *(CAmount *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
             0x18) = CStack_618;
          }
          else {
            *(bool **)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                 local_630;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                              _M_u + 0x10) = CONCAT71(local_620._1_7_,local_620[0]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
               local_628;
          local_628._0_4_ = LEGACY;
          local_628._4_4_ = (_Storage<OutputType,_true>)0x0;
          local_620[0] = false;
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 0x30);
          *(undefined8 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20)
               = puVar1;
          if ((pointer)local_610._0_8_ == pcVar9) {
            *puVar1 = CONCAT71(local_610._17_7_,local_610[0x10]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
             0x38) = local_610._24_8_;
          }
          else {
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
             0x20) = local_610._0_8_;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                              _M_u + 0x30) = CONCAT71(local_610._17_7_,local_610[0x10]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28)
               = local_610._8_8_;
          local_610._8_8_ = (pointer)0x0;
          local_610[0x10] = '\0';
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
          local_630 = local_620;
          local_610._0_8_ = pcVar9;
        }
        std::filesystem::__cxx11::path::~path(&backup_path.super_path);
        std::filesystem::__cxx11::path::~path(&backup_filename.super_path);
        std::filesystem::__cxx11::path::~path(&this_wallet_dir.super_path);
      }
      else {
        if ((char)uVar22 != '\0') {
          MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()(&local_a18,&local_wallet);
        }
        local_528 = &local_518;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_528,"Error: This wallet is already a descriptor wallet","");
        paVar3 = &local_508.field_2;
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_508._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_508,"Error: This wallet is already a descriptor wallet","");
        }
        else {
          wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)anon_var_dwarf_1d748d7;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_508,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&wallet);
        }
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
        if (local_528 == &local_518) {
          *puVar1 = CONCAT71(uStack_517,local_518);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18)
               = uStack_510;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = local_528;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                            _M_u + 0x10) = CONCAT71(uStack_517,local_518);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
             local_520;
        local_520 = 0;
        local_518 = 0;
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
             puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p == paVar3) {
          *puVar1 = CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,
                             local_508.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38)
               = local_508.field_2._8_8_;
        }
        else {
          *(pointer *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20)
               = local_508._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                            _M_u + 0x30) =
               CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,
                        local_508.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
             local_508._M_string_length;
        local_508._M_string_length = 0;
        local_508.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
        local_528 = &local_518;
        local_508._M_dataplus._M_p = (pointer)paVar3;
      }
    }
    if (local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (local_9d8 != (long *)0x0) {
    (**(code **)(*local_9d8 + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    _GLOBAL__N_1::std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>
    ::_M_destroy(&local_290,
                 CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                          local_290.field_2._M_local_buf[0]));
  }
  WalletContext::~WalletContext(&empty_context);
LAB_0053fb8c:
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&warnings);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.translated._M_dataplus._M_p != &error.translated.field_2) {
    operator_delete(error.translated._M_dataplus._M_p,
                    CONCAT71(error.translated.field_2._M_allocated_capacity._1_7_,
                             error.translated.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.original._M_dataplus._M_p != &error.original.field_2) {
    operator_delete(error.original._M_dataplus._M_p,
                    CONCAT71(error.original.field_2._M_allocated_capacity._1_7_,
                             error.original.field_2._M_local_buf[0]) + 1);
  }
  std::filesystem::__cxx11::path::~path(&res.backup_path.super_path);
  if (res.solvables_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               res.solvables_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (res.watchonly_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               res.watchonly_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (res.wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               res.wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.wallet_name._M_dataplus._M_p != &res.wallet_name.field_2) {
    operator_delete(res.wallet_name._M_dataplus._M_p,
                    CONCAT71(res.wallet_name.field_2._M_allocated_capacity._1_7_,
                             res.wallet_name.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar7) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<MigrationResult> MigrateLegacyToDescriptor(const std::string& wallet_name, const SecureString& passphrase, WalletContext& context)
{
    MigrationResult res;
    bilingual_str error;
    std::vector<bilingual_str> warnings;

    // If the wallet is still loaded, unload it so that nothing else tries to use it while we're changing it
    bool was_loaded = false;
    if (auto wallet = GetWallet(context, wallet_name)) {
        if (wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
            return util::Error{_("Error: This wallet is already a descriptor wallet")};
        }

        if (!RemoveWallet(context, wallet, /*load_on_start=*/std::nullopt, warnings)) {
            return util::Error{_("Unable to unload the wallet before migrating")};
        }
        WaitForDeleteWallet(std::move(wallet));
        was_loaded = true;
    } else {
        // Check if the wallet is BDB
        const auto& wallet_path = GetWalletPath(wallet_name);
        if (!wallet_path) {
            return util::Error{util::ErrorString(wallet_path)};
        }
        if (!IsBDBFile(BDBDataFile(*wallet_path))) {
            return util::Error{_("Error: This wallet is already a descriptor wallet")};
        }
    }

    // Load the wallet but only in the context of this function.
    // No signals should be connected nor should anything else be aware of this wallet
    WalletContext empty_context;
    empty_context.args = context.args;
    DatabaseOptions options;
    options.require_existing = true;
    options.require_format = DatabaseFormat::BERKELEY_RO;
    DatabaseStatus status;
    std::unique_ptr<WalletDatabase> database = MakeWalletDatabase(wallet_name, options, status, error);
    if (!database) {
        return util::Error{Untranslated("Wallet file verification failed.") + Untranslated(" ") + error};
    }

    // Make the local wallet
    std::shared_ptr<CWallet> local_wallet = CWallet::Create(empty_context, wallet_name, std::move(database), options.create_flags, error, warnings);
    if (!local_wallet) {
        return util::Error{Untranslated("Wallet loading failed.") + Untranslated(" ") + error};
    }

    // Helper to reload as normal for some of our exit scenarios
    const auto& reload_wallet = [&](std::shared_ptr<CWallet>& to_reload) {
        // Reset options.require_format as wallets of any format may be reloaded.
        options.require_format = std::nullopt;
        assert(to_reload.use_count() == 1);
        std::string name = to_reload->GetName();
        to_reload.reset();
        to_reload = LoadWallet(context, name, /*load_on_start=*/std::nullopt, options, status, error, warnings);
        return to_reload != nullptr;
    };

    // Before anything else, check if there is something to migrate.
    if (local_wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        if (was_loaded) {
            reload_wallet(local_wallet);
        }
        return util::Error{_("Error: This wallet is already a descriptor wallet")};
    }

    // Make a backup of the DB
    fs::path this_wallet_dir = fs::absolute(fs::PathFromString(local_wallet->GetDatabase().Filename())).parent_path();
    fs::path backup_filename = fs::PathFromString(strprintf("%s_%d.legacy.bak", (wallet_name.empty() ? "default_wallet" : wallet_name), GetTime()));
    fs::path backup_path = this_wallet_dir / backup_filename;
    if (!local_wallet->BackupWallet(fs::PathToString(backup_path))) {
        if (was_loaded) {
            reload_wallet(local_wallet);
        }
        return util::Error{_("Error: Unable to make a backup of your wallet")};
    }
    res.backup_path = backup_path;

    bool success = false;

    // Unlock the wallet if needed
    if (local_wallet->IsLocked() && !local_wallet->Unlock(passphrase)) {
        if (was_loaded) {
            reload_wallet(local_wallet);
        }
        if (passphrase.find('\0') == std::string::npos) {
            return util::Error{Untranslated("Error: Wallet decryption failed, the wallet passphrase was not provided or was incorrect.")};
        } else {
            return util::Error{Untranslated("Error: Wallet decryption failed, the wallet passphrase entered was incorrect. "
                                            "The passphrase contains a null character (ie - a zero byte). "
                                            "If this passphrase was set with a version of this software prior to 25.0, "
                                            "please try again with only the characters up to — but not including — "
                                            "the first null character.")};
        }
    }

    {
        LOCK(local_wallet->cs_wallet);
        // First change to using SQLite
        if (!local_wallet->MigrateToSQLite(error)) return util::Error{error};

        // Do the migration of keys and scripts for non-blank wallets, and cleanup if it fails
        success = local_wallet->IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET);
        if (!success) {
            success = DoMigration(*local_wallet, context, error, res);
        } else {
            // Make sure that descriptors flag is actually set
            local_wallet->SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
        }
    }

    // In case of reloading failure, we need to remember the wallet dirs to remove
    // Set is used as it may be populated with the same wallet directory paths multiple times,
    // both before and after reloading. This ensures the set is complete even if one of the wallets
    // fails to reload.
    std::set<fs::path> wallet_dirs;
    if (success) {
        // Migration successful, unload all wallets locally, then reload them.
        // Reload the main wallet
        wallet_dirs.insert(fs::PathFromString(local_wallet->GetDatabase().Filename()).parent_path());
        success = reload_wallet(local_wallet);
        res.wallet = local_wallet;
        res.wallet_name = wallet_name;
        if (success && res.watchonly_wallet) {
            // Reload watchonly
            wallet_dirs.insert(fs::PathFromString(res.watchonly_wallet->GetDatabase().Filename()).parent_path());
            success = reload_wallet(res.watchonly_wallet);
        }
        if (success && res.solvables_wallet) {
            // Reload solvables
            wallet_dirs.insert(fs::PathFromString(res.solvables_wallet->GetDatabase().Filename()).parent_path());
            success = reload_wallet(res.solvables_wallet);
        }
    }
    if (!success) {
        // Migration failed, cleanup
        // Copy the backup to the actual wallet dir
        fs::path temp_backup_location = fsbridge::AbsPathJoin(GetWalletDir(), backup_filename);
        fs::copy_file(backup_path, temp_backup_location, fs::copy_options::none);

        // Make list of wallets to cleanup
        std::vector<std::shared_ptr<CWallet>> created_wallets;
        if (local_wallet) created_wallets.push_back(std::move(local_wallet));
        if (res.watchonly_wallet) created_wallets.push_back(std::move(res.watchonly_wallet));
        if (res.solvables_wallet) created_wallets.push_back(std::move(res.solvables_wallet));

        // Get the directories to remove after unloading
        for (std::shared_ptr<CWallet>& w : created_wallets) {
            wallet_dirs.emplace(fs::PathFromString(w->GetDatabase().Filename()).parent_path());
        }

        // Unload the wallets
        for (std::shared_ptr<CWallet>& w : created_wallets) {
            if (w->HaveChain()) {
                // Unloading for wallets that were loaded for normal use
                if (!RemoveWallet(context, w, /*load_on_start=*/false)) {
                    error += _("\nUnable to cleanup failed migration");
                    return util::Error{error};
                }
                WaitForDeleteWallet(std::move(w));
            } else {
                // Unloading for wallets in local context
                assert(w.use_count() == 1);
                w.reset();
            }
        }

        // Delete the wallet directories
        for (const fs::path& dir : wallet_dirs) {
            fs::remove_all(dir);
        }

        // Restore the backup
        DatabaseStatus status;
        std::vector<bilingual_str> warnings;
        if (!RestoreWallet(context, temp_backup_location, wallet_name, /*load_on_start=*/std::nullopt, status, error, warnings)) {
            error += _("\nUnable to restore backup of wallet.");
            return util::Error{error};
        }

        // Move the backup to the wallet dir
        fs::copy_file(temp_backup_location, backup_path, fs::copy_options::none);
        fs::remove(temp_backup_location);

        return util::Error{error};
    }
    return res;
}